

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O3

void __thiscall
GlobOpt::CaptureValuesIncremental
          (GlobOpt *this,BasicBlock *block,EditingIterator *bailOutConstValuesIter,
          EditingIterator *bailOutCopySymsIter,BVSparse<Memory::JitArenaAllocator> *argsToCapture)

{
  SymKind SVar1;
  Type TVar2;
  SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount> *pSVar3
  ;
  StackSym *pSVar4;
  ValueInfo *this_00;
  code *pcVar5;
  BOOLEAN BVar6;
  bool bVar7;
  IRType IVar8;
  uint uVar9;
  undefined4 *puVar10;
  Type *pTVar11;
  Type *pTVar12;
  Value *pVVar13;
  HashBucket *pHVar14;
  VarConstantValueInfo *pVVar15;
  ulong uVar16;
  ulong uVar17;
  uint key;
  Type_conflict pBVar18;
  ulong uVar19;
  StackSym *pSVar20;
  JitArenaAllocator *pJVar21;
  bool bVar22;
  bool bVar23;
  BailoutConstantValue param2;
  BailoutConstantValue param2_00;
  BailoutConstantValue param2_01;
  undefined1 local_98 [8];
  BailoutConstantValue constValue;
  int32 intConstValue;
  undefined1 local_60 [8];
  Iterator iterConst;
  Iterator iterCopyPropSym;
  
  local_60 = (undefined1  [8])(block->globOptData).capturedValues;
  iterConst.current =
       &(((CapturedValues *)local_60)->copyPropSyms).super_SListNodeBase<Memory::ArenaAllocator>;
  if (local_60 == (undefined1  [8])0x0) {
    bVar22 = false;
    bVar23 = false;
    iterConst.list =
         (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
          *)0x0;
    iterConst.current = (NodeBase *)0x0;
    iterCopyPropSym.list =
         (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
          *)0x0;
  }
  else {
    iterConst.list =
         (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
          *)(((CapturedValues *)local_60)->constantValues).
            super_SListNodeBase<Memory::ArenaAllocator>.next;
    bVar22 = (undefined1  [8])iterConst.list != local_60;
    if (!bVar22) {
      iterConst.list = &((CapturedValues *)0x0)->constantValues;
    }
    pSVar3 = (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
              *)(((CapturedValues *)local_60)->copyPropSyms).
                super_SListNodeBase<Memory::ArenaAllocator>.next;
    bVar23 = pSVar3 != (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                        *)iterConst.current;
    iterCopyPropSym.list =
         (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
          *)(CapturedValues *)0x0;
    if (bVar23) {
      iterCopyPropSym.list = pSVar3;
    }
  }
  BVSparse<Memory::JitArenaAllocator>::Set((block->globOptData).changedSyms,0xffffffff);
  if (argsToCapture != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
              ((block->globOptData).changedSyms,argsToCapture);
  }
  pBVar18 = ((block->globOptData).changedSyms)->head;
  if (pBVar18 != (Type_conflict)0x0) {
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      uVar16 = (pBVar18->data).word;
      if (uVar16 != 0) {
        TVar2 = pBVar18->startIndex;
        uVar19 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
          }
        }
        do {
          key = TVar2 + (BVIndex)uVar19;
          BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar19);
          if (bVar22) {
            pTVar11 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                      ::Iterator::Data((Iterator *)local_60);
            pSVar20 = pTVar11->key;
            if (pSVar20 != (StackSym *)0x0) {
              uVar9 = (pSVar20->super_Sym).m_id;
              if (uVar9 < key) {
                do {
                  if ((pSVar20->super_Sym).m_kind != SymKindStack) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar10 = 1;
                    bVar22 = Js::Throw::ReportAssert
                                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                                        ,0x73,"(constSym->IsStackSym())","constSym->IsStackSym()");
                    if (!bVar22) goto LAB_00489314;
                    *puVar10 = 0;
                    if ((pSVar20->super_Sym).m_kind != SymKindStack) {
                      AssertCount = AssertCount + 1;
                      Js::Throw::LogAssert();
                      *puVar10 = 1;
                      bVar22 = Js::Throw::ReportAssert
                                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                          ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
                      if (!bVar22) goto LAB_00489314;
                      *puVar10 = 0;
                    }
                  }
                  if ((pSVar20->field_0x1a & 0x30) == 0) {
                    pJVar21 = this->func->m_alloc;
                    if ((pSVar20->super_Sym).m_kind != SymKindStack) {
                      AssertCount = AssertCount + 1;
                      Js::Throw::LogAssert();
                      *puVar10 = 1;
                      bVar22 = Js::Throw::ReportAssert
                                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                          ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
                      if (!bVar22) goto LAB_00489314;
                      *puVar10 = 0;
                    }
                    pTVar11 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                              ::Iterator::Data((Iterator *)local_60);
                    param2._4_4_ = 0;
                    param2.type = (pTVar11->value).type;
                    param2._1_3_ = *(undefined3 *)&(pTVar11->value).field_0x1;
                    param2.u = (pTVar11->value).u;
                    SListBase<JsUtil::KeyValuePair<StackSym*,BailoutConstantValue>,Memory::ArenaAllocator,RealCount>
                    ::EditingIterator::InsertNodeBefore<StackSym*,BailoutConstantValue>
                              ((EditingIterator *)bailOutConstValuesIter,
                               &pJVar21->super_ArenaAllocator,pSVar20,param2);
                  }
                  if (iterConst.list ==
                      (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                       *)0x0) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar10 = 1;
                    bVar22 = Js::Throw::ReportAssert
                                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                        ,0x76,"(current != nullptr)","current != nullptr");
                    if (!bVar22) goto LAB_00489314;
                    *puVar10 = 0;
                  }
                  iterConst.list =
                       (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                        *)((iterConst.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
                  if ((undefined1  [8])iterConst.list == local_60) {
                    iterConst.list =
                         (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                          *)0x0;
                    bVar22 = false;
                    goto LAB_004889ad;
                  }
                  pTVar11 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                            ::Iterator::Data((Iterator *)local_60);
                  pSVar20 = pTVar11->key;
                  if (pSVar20 == (StackSym *)0x0) {
                    bVar22 = true;
                    goto LAB_004889ad;
                  }
                  uVar9 = (pSVar20->super_Sym).m_id;
                } while (uVar9 < key);
                bVar22 = true;
              }
              if (uVar9 == key) {
                if (iterConst.list ==
                    (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                     *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar10 = 1;
                  bVar22 = Js::Throw::ReportAssert
                                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                      ,0x76,"(current != nullptr)","current != nullptr");
                  if (!bVar22) goto LAB_00489314;
                  *puVar10 = 0;
                }
                iterConst.list =
                     (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                      *)((iterConst.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
                bVar22 = (undefined1  [8])iterConst.list != local_60;
                if (!bVar22) {
                  iterConst.list =
                       (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                        *)0x0;
                }
              }
            }
          }
LAB_004889ad:
          if (bVar23) {
            pTVar12 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                      ::Iterator::Data((Iterator *)&iterConst.current);
            pSVar20 = pTVar12->key;
            if (pSVar20 != (StackSym *)0x0) {
              uVar9 = (pSVar20->super_Sym).m_id;
              if (uVar9 < key) {
                do {
                  pTVar12 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                            ::Iterator::Data((Iterator *)&iterConst.current);
                  pSVar4 = pTVar12->value;
                  if ((pSVar20->super_Sym).m_kind != SymKindStack) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar10 = 1;
                    bVar23 = Js::Throw::ReportAssert
                                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                                        ,0x87,"(capturedSym->IsStackSym())",
                                        "capturedSym->IsStackSym()");
                    if (!bVar23) goto LAB_00489314;
                    *puVar10 = 0;
                  }
                  BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                                    ((block->globOptData).changedSyms,(pSVar4->super_Sym).m_id);
                  SVar1 = (pSVar20->super_Sym).m_kind;
                  if (BVar6 == '\0') {
                    if (SVar1 != SymKindStack) {
                      AssertCount = AssertCount + 1;
                      Js::Throw::LogAssert();
                      *puVar10 = 1;
                      bVar23 = Js::Throw::ReportAssert
                                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                          ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
                      if (!bVar23) goto LAB_00489314;
                      *puVar10 = 0;
                    }
                    if ((pSVar20->field_0x1a & 0x30) == 0) {
                      pJVar21 = this->func->m_alloc;
                      if ((pSVar20->super_Sym).m_kind != SymKindStack) {
                        AssertCount = AssertCount + 1;
                        Js::Throw::LogAssert();
                        *puVar10 = 1;
                        bVar23 = Js::Throw::ReportAssert
                                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                            ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()")
                        ;
                        if (!bVar23) goto LAB_00489314;
                        *puVar10 = 0;
                      }
                      SListBase<JsUtil::KeyValuePair<StackSym*,StackSym*>,Memory::ArenaAllocator,RealCount>
                      ::EditingIterator::InsertNodeBefore<StackSym*,StackSym*>
                                ((EditingIterator *)bailOutCopySymsIter,
                                 &pJVar21->super_ArenaAllocator,pSVar20,pSVar4);
                    }
                  }
                  else {
                    if (SVar1 != SymKindStack) {
                      AssertCount = AssertCount + 1;
                      Js::Throw::LogAssert();
                      *puVar10 = 1;
                      bVar23 = Js::Throw::ReportAssert
                                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                          ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
                      if (!bVar23) goto LAB_00489314;
                      *puVar10 = 0;
                    }
                    if (((pSVar20->field_0x1a & 0x30) == 0) &&
                       (pVVar13 = GlobOptBlockData::FindValue
                                            (&this->currentBlock->globOptData,&pSVar20->super_Sym),
                       pVVar13 != (Value *)0x0)) {
                      CaptureCopyPropValue
                                (this,block,&pSVar20->super_Sym,pVVar13,bailOutCopySymsIter);
                    }
                  }
                  if (iterCopyPropSym.list ==
                      (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                       *)0x0) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar10 = 1;
                    bVar23 = Js::Throw::ReportAssert
                                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                        ,0x76,"(current != nullptr)","current != nullptr");
                    if (!bVar23) goto LAB_00489314;
                    *puVar10 = 0;
                  }
                  iterCopyPropSym.list =
                       (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                        *)((iterCopyPropSym.list)->super_SListNodeBase<Memory::ArenaAllocator>).next
                  ;
                  if (iterCopyPropSym.list ==
                      (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                       *)iterConst.current) {
                    iterCopyPropSym.list =
                         (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                          *)0x0;
                    bVar23 = false;
                    goto LAB_00488cbc;
                  }
                  pTVar12 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                            ::Iterator::Data((Iterator *)&iterConst.current);
                  pSVar20 = pTVar12->key;
                  if (pSVar20 == (StackSym *)0x0) {
                    bVar23 = true;
                    goto LAB_00488cbc;
                  }
                  uVar9 = (pSVar20->super_Sym).m_id;
                } while (uVar9 < key);
                bVar23 = true;
              }
              if (uVar9 == key) {
                if (iterCopyPropSym.list ==
                    (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                     *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar10 = 1;
                  bVar23 = Js::Throw::ReportAssert
                                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                      ,0x76,"(current != nullptr)","current != nullptr");
                  if (!bVar23) goto LAB_00489314;
                  *puVar10 = 0;
                }
                iterCopyPropSym.list =
                     (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                      *)((iterCopyPropSym.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
                bVar23 = iterCopyPropSym.list !=
                         (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                          *)iterConst.current;
                if (!bVar23) {
                  iterCopyPropSym.list =
                       (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                        *)0x0;
                }
              }
            }
          }
LAB_00488cbc:
          if ((key != 0xffffffff) &&
             (pHVar14 = ValueHashTable<Sym_*,_Value_*>::GetBucket
                                  ((block->globOptData).symToValueMap,key),
             pHVar14 != (HashBucket *)0x0)) {
            pSVar20 = (StackSym *)pHVar14->value;
            if (((pSVar20->super_Sym).m_kind != SymKindStack) ||
               ((*(ushort *)&pSVar20->field_0x19 & 0x3020) == 0)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar10 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                                 ,0xac,
                                 "(symIdSym->IsStackSym() && (symIdSym->AsStackSym()->HasByteCodeRegSlot() || symIdSym->AsStackSym()->HasArgSlotNum()))"
                                 ,
                                 "symIdSym->IsStackSym() && (symIdSym->AsStackSym()->HasByteCodeRegSlot() || symIdSym->AsStackSym()->HasArgSlotNum())"
                                );
              if (!bVar7) goto LAB_00489314;
              *puVar10 = 0;
            }
            pVVar13 = pHVar14->element;
            if (pVVar13 == (Value *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar10 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                                 ,0xaf,"(val)","val");
              if (!bVar7) goto LAB_00489314;
              *puVar10 = 0;
            }
            this_00 = pVVar13->valueInfo;
            if (this_00->symStore != (Sym *)0x0) {
              bVar7 = ValueInfo::TryGetIntConstantValue
                                (this_00,(int32 *)((long)&constValue.u.intConst.value + 4),false);
              if (bVar7) {
                constValue._0_8_ = SEXT48((int)constValue.u.intConst.value._4_4_);
                local_98[0] = 3;
                pJVar21 = this->func->m_alloc;
                IVar8 = TyInt32;
                if ((pSVar20->super_Sym).m_kind != SymKindStack) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar10 = 1;
                  bVar7 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                     ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
                  if (!bVar7) goto LAB_00489314;
                  *puVar10 = 0;
                  IVar8 = local_98[0];
                }
                uVar17 = (ulong)IVar8;
              }
              else {
                bVar7 = ValueInfo::IsVarConstant(this_00);
                if (!bVar7) {
                  CaptureCopyPropValue(this,block,(Sym *)pSVar20,pVVar13,bailOutCopySymsIter);
                  goto LAB_00488ee7;
                }
                pVVar15 = ValueInfo::AsVarConstant(this_00);
                BailoutConstantValue::InitVarConstValue
                          ((BailoutConstantValue *)local_98,pVVar15->varValue);
                pJVar21 = this->func->m_alloc;
                if ((pSVar20->super_Sym).m_kind != SymKindStack) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar10 = 1;
                  bVar7 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                     ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
                  if (!bVar7) goto LAB_00489314;
                  *puVar10 = 0;
                }
                uVar17 = (ulong)(uint)local_98._0_4_;
              }
              param2_00.u = (anon_union_8_3_5e50e90d_for_u)constValue._0_8_;
              param2_00._0_8_ = uVar17;
              SListBase<JsUtil::KeyValuePair<StackSym*,BailoutConstantValue>,Memory::ArenaAllocator,RealCount>
              ::EditingIterator::InsertNodeBefore<StackSym*,BailoutConstantValue>
                        ((EditingIterator *)bailOutConstValuesIter,&pJVar21->super_ArenaAllocator,
                         pSVar20,param2_00);
            }
          }
LAB_00488ee7:
          uVar16 = uVar16 & ~(1L << (uVar19 & 0x3f));
          uVar19 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
            }
          }
        } while (uVar16 != 0);
      }
      pBVar18 = pBVar18->next;
    } while (pBVar18 != (Type)0x0);
  }
  if (bVar22) {
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      pTVar11 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                ::Iterator::Data((Iterator *)local_60);
      pSVar20 = pTVar11->key;
      if ((pSVar20->super_Sym).m_kind != SymKindStack) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar22 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                            ,0xd1,"(constSym->IsStackSym())","constSym->IsStackSym()");
        if (!bVar22) goto LAB_00489314;
        *puVar10 = 0;
      }
      BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                        ((block->globOptData).changedSyms,(pSVar20->super_Sym).m_id);
      if (BVar6 != '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar22 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                            ,0xd2,"(!block->globOptData.changedSyms->Test(constSym->m_id))",
                            "!block->globOptData.changedSyms->Test(constSym->m_id)");
        if (!bVar22) goto LAB_00489314;
        *puVar10 = 0;
      }
      if ((pSVar20->super_Sym).m_kind != SymKindStack) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar22 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                            ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar22) goto LAB_00489314;
        *puVar10 = 0;
      }
      if ((pSVar20->field_0x1a & 0x30) == 0) {
        pJVar21 = this->func->m_alloc;
        if ((pSVar20->super_Sym).m_kind != SymKindStack) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar22 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                              ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
          if (!bVar22) goto LAB_00489314;
          *puVar10 = 0;
        }
        pTVar11 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                  ::Iterator::Data((Iterator *)local_60);
        param2_01._4_4_ = 0;
        param2_01.type = (pTVar11->value).type;
        param2_01._1_3_ = *(undefined3 *)&(pTVar11->value).field_0x1;
        param2_01.u = (pTVar11->value).u;
        SListBase<JsUtil::KeyValuePair<StackSym*,BailoutConstantValue>,Memory::ArenaAllocator,RealCount>
        ::EditingIterator::InsertNodeBefore<StackSym*,BailoutConstantValue>
                  ((EditingIterator *)bailOutConstValuesIter,&pJVar21->super_ArenaAllocator,pSVar20,
                   param2_01);
      }
      if (iterConst.list ==
          (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
           *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar22 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                            ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar22) goto LAB_00489314;
        *puVar10 = 0;
      }
      iterConst.list =
           (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
            *)((iterConst.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    } while ((undefined1  [8])iterConst.list != local_60);
    iterConst.list =
         (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
          *)0x0;
  }
  if (bVar23) {
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      pTVar12 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                ::Iterator::Data((Iterator *)&iterConst.current);
      pSVar20 = pTVar12->key;
      pTVar12 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                ::Iterator::Data((Iterator *)&iterConst.current);
      pSVar4 = pTVar12->value;
      if ((pSVar20->super_Sym).m_kind != SymKindStack) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar22 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                            ,0xe1,"(capturedSym->IsStackSym())","capturedSym->IsStackSym()");
        if (!bVar22) {
LAB_00489314:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar10 = 0;
      }
      BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                        ((block->globOptData).changedSyms,(pSVar20->super_Sym).m_id);
      if ((BVar6 != '\0') ||
         (BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                            ((block->globOptData).changedSyms,(pSVar4->super_Sym).m_id),
         BVar6 != '\0')) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar22 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                            ,0xe3,
                            "(!block->globOptData.changedSyms->Test(capturedSym->m_id) && !block->globOptData.changedSyms->Test(capturedCopyPropSym->m_id))"
                            ,
                            "!block->globOptData.changedSyms->Test(capturedSym->m_id) && !block->globOptData.changedSyms->Test(capturedCopyPropSym->m_id)"
                           );
        if (!bVar22) goto LAB_00489314;
        *puVar10 = 0;
      }
      if ((pSVar20->super_Sym).m_kind != SymKindStack) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar22 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                            ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar22) goto LAB_00489314;
        *puVar10 = 0;
      }
      if ((pSVar20->field_0x1a & 0x30) == 0) {
        pJVar21 = this->func->m_alloc;
        if ((pSVar20->super_Sym).m_kind != SymKindStack) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar22 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                              ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
          if (!bVar22) goto LAB_00489314;
          *puVar10 = 0;
        }
        SListBase<JsUtil::KeyValuePair<StackSym*,StackSym*>,Memory::ArenaAllocator,RealCount>::
        EditingIterator::InsertNodeBefore<StackSym*,StackSym*>
                  ((EditingIterator *)bailOutCopySymsIter,&pJVar21->super_ArenaAllocator,pSVar20,
                   pSVar4);
      }
      if (iterCopyPropSym.list ==
          (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
           *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar22 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                            ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar22) goto LAB_00489314;
        *puVar10 = 0;
      }
      iterCopyPropSym.list =
           (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
            *)((iterCopyPropSym.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    } while (iterCopyPropSym.list !=
             (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
              *)iterConst.current);
  }
  return;
}

Assistant:

void
GlobOpt::CaptureValuesIncremental(BasicBlock * block,
    SListBase<ConstantStackSymValue>::EditingIterator & bailOutConstValuesIter,
    SListBase<CopyPropSyms>::EditingIterator & bailOutCopySymsIter,
    BVSparse<JitArenaAllocator>* argsToCapture)
{
    CapturedValues * currCapturedValues = block->globOptData.capturedValues;
    SListBase<ConstantStackSymValue>::Iterator iterConst(currCapturedValues ? &currCapturedValues->constantValues : nullptr);
    SListBase<CopyPropSyms>::Iterator iterCopyPropSym(currCapturedValues ? &currCapturedValues->copyPropSyms : nullptr);
    bool hasConstValue = currCapturedValues ? iterConst.Next() : false;
    bool hasCopyPropSym = currCapturedValues ? iterCopyPropSym.Next() : false;

    block->globOptData.changedSyms->Set(Js::Constants::InvalidSymID);

    if (argsToCapture)
    {
        block->globOptData.changedSyms->Or(argsToCapture);
    }

    FOREACH_BITSET_IN_SPARSEBV(symId, block->globOptData.changedSyms)
    {
        Value * val = nullptr;

        // First process all unchanged syms with m_id < symId. Then, recapture the current changed sym.

        // copy unchanged const sym to new capturedValues
        Sym * constSym = hasConstValue ? iterConst.Data().Key() : nullptr;
        while (constSym && constSym->m_id < symId)
        {
            Assert(constSym->IsStackSym());
            if (!constSym->AsStackSym()->HasArgSlotNum())
            {
                bailOutConstValuesIter.InsertNodeBefore(this->func->m_alloc, constSym->AsStackSym(), iterConst.Data().Value());
            }

            hasConstValue = iterConst.Next();
            constSym = hasConstValue ? iterConst.Data().Key() : nullptr;
        }
        if (constSym && constSym->m_id == symId)
        {
            hasConstValue = iterConst.Next();
        }

        // process unchanged sym; copy-prop sym might have changed
        Sym * capturedSym = hasCopyPropSym ? iterCopyPropSym.Data().Key() : nullptr;
        while (capturedSym && capturedSym->m_id < symId)
        {
            StackSym * capturedCopyPropSym = iterCopyPropSym.Data().Value();

            Assert(capturedSym->IsStackSym());

            if (!block->globOptData.changedSyms->Test(capturedCopyPropSym->m_id))
            {
                if (!capturedSym->AsStackSym()->HasArgSlotNum())
                {
                    bailOutCopySymsIter.InsertNodeBefore(this->func->m_alloc, capturedSym->AsStackSym(), capturedCopyPropSym);
                }
            }
            else
            {
                if (!capturedSym->AsStackSym()->HasArgSlotNum())
                {
                    val = this->currentBlock->globOptData.FindValue(capturedSym);
                    if (val != nullptr)
                    {
                        CaptureCopyPropValue(block, capturedSym, val, bailOutCopySymsIter);
                    }
                }
            }

            hasCopyPropSym = iterCopyPropSym.Next();
            capturedSym = hasCopyPropSym ? iterCopyPropSym.Data().Key() : nullptr;
        }
        if (capturedSym && capturedSym->m_id == symId)
        {
            hasCopyPropSym = iterCopyPropSym.Next();
        }

        // recapture changed sym
        HashBucket<Sym *, Value *> * symIdBucket = nullptr;
        if (symId != Js::Constants::InvalidSymID)
        {
            symIdBucket = block->globOptData.symToValueMap->GetBucket(symId);
            if (symIdBucket != nullptr)
            {
                Sym * symIdSym = symIdBucket->value;
                Assert(symIdSym->IsStackSym() && (symIdSym->AsStackSym()->HasByteCodeRegSlot() || symIdSym->AsStackSym()->HasArgSlotNum()));

                val = symIdBucket->element;
                Assert(val);
                ValueInfo* valueInfo = val->GetValueInfo();

                if (valueInfo->GetSymStore() != nullptr)
                {
                    int32 intConstValue;
                    BailoutConstantValue constValue;

                    if (valueInfo->TryGetIntConstantValue(&intConstValue))
                    {
                        constValue.InitIntConstValue(intConstValue);
                        bailOutConstValuesIter.InsertNodeBefore(this->func->m_alloc, symIdSym->AsStackSym(), constValue);
                    }
                    else if (valueInfo->IsVarConstant())
                    {
                        constValue.InitVarConstValue(valueInfo->AsVarConstant()->VarValue());
                        bailOutConstValuesIter.InsertNodeBefore(this->func->m_alloc, symIdSym->AsStackSym(), constValue);
                    }
                    else
                    {
                        CaptureCopyPropValue(block, symIdSym, val, bailOutCopySymsIter);
                    }
                }
            }
        }
    }
    NEXT_BITSET_IN_SPARSEBV

    // If, after going over the set of changed syms since the last time we captured values,
    // there are remaining unprocessed entries in the current captured values set,
    // they can simply be copied over to the new bailout info.
    while (hasConstValue)
    {
        Sym * constSym = iterConst.Data().Key();
        Assert(constSym->IsStackSym());
        Assert(!block->globOptData.changedSyms->Test(constSym->m_id));

        if (!constSym->AsStackSym()->HasArgSlotNum())
        {
            bailOutConstValuesIter.InsertNodeBefore(this->func->m_alloc, constSym->AsStackSym(), iterConst.Data().Value());
        }

        hasConstValue = iterConst.Next();
    }

    while (hasCopyPropSym)
    {
        Sym * capturedSym = iterCopyPropSym.Data().Key();
        StackSym * capturedCopyPropSym = iterCopyPropSym.Data().Value();

        Assert(capturedSym->IsStackSym());
        Assert(!block->globOptData.changedSyms->Test(capturedSym->m_id) &&
            !block->globOptData.changedSyms->Test(capturedCopyPropSym->m_id));

        if (!capturedSym->AsStackSym()->HasArgSlotNum())
        {
            bailOutCopySymsIter.InsertNodeBefore(this->func->m_alloc, capturedSym->AsStackSym(), capturedCopyPropSym);
        }

        hasCopyPropSym = iterCopyPropSym.Next();
    }
}